

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  uint uVar1;
  uint uVar2;
  stbi__context *s;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  stbi__uint32 sVar7;
  uint uVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int *piVar16;
  int iVar17;
  char *pcVar18;
  ulong uVar19;
  int iVar20;
  stbi__int16 *psVar21;
  
  z->marker = 0xff;
  sVar3 = stbi__get_marker(z);
  pcVar18 = "Corrupt JPEG";
  if (sVar3 == 0xd8) {
    if (scan == 1) {
      return 1;
    }
    bVar4 = stbi__get_marker(z);
    while ((bVar4 != 0xc2 && ((bVar4 & 0xfe) != 0xc0))) {
      iVar5 = stbi__process_marker(z,(uint)bVar4);
      if (iVar5 == 0) {
        return 0;
      }
      while (bVar4 = stbi__get_marker(z), bVar4 == 0xff) {
        iVar5 = stbi__at_eof(z->s);
        if (iVar5 != 0) {
          stbi__g_failure_reason = pcVar18;
          return 0;
        }
      }
    }
    z->progressive = (uint)(bVar4 == 0xc2);
    s = z->s;
    uVar6 = stbi__get16be(s);
    if (10 < uVar6) {
      sVar3 = stbi__get8(s);
      if (sVar3 == '\b') {
        sVar7 = stbi__get16be(s);
        s->img_y = sVar7;
        if (sVar7 == 0) {
          pcVar18 = "JPEG format not supported: delayed height";
        }
        else {
          sVar7 = stbi__get16be(s);
          s->img_x = sVar7;
          if ((sVar7 != 0) && (bVar4 = stbi__get8(s), (bVar4 & 0xfd) == 1)) {
            s->img_n = (uint)bVar4;
            for (lVar12 = 0; (ulong)(uint)bVar4 * 0x60 - lVar12 != 0; lVar12 = lVar12 + 0x60) {
              *(undefined8 *)((long)&z->img_comp[0].data + lVar12) = 0;
              *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar12) = 0;
            }
            if (uVar6 == (uint)bVar4 + (uint)bVar4 * 2 + 8) {
              piVar16 = &z->img_comp[0].tq;
              uVar10 = 0;
              while (uVar6 = s->img_n, (long)uVar10 < (long)(int)uVar6) {
                bVar4 = stbi__get8(s);
                ((anon_struct_96_18_0d0905d3 *)(piVar16 + -3))->id = (uint)bVar4;
                if (uVar10 + 1 != (ulong)bVar4 && uVar10 != bVar4) {
                  stbi__g_failure_reason = pcVar18;
                  return 0;
                }
                bVar4 = stbi__get8(s);
                piVar16[-2] = (uint)(bVar4 >> 4);
                if ((byte)(bVar4 + 0xb0) < 0xc0) {
                  stbi__g_failure_reason = pcVar18;
                  return 0;
                }
                piVar16[-1] = bVar4 & 0xf;
                if ((bVar4 & 0xf) - 5 < 0xfffffffc) {
                  stbi__g_failure_reason = pcVar18;
                  return 0;
                }
                bVar4 = stbi__get8(s);
                *piVar16 = (uint)bVar4;
                piVar16 = piVar16 + 0x18;
                uVar10 = uVar10 + 1;
                if (3 < bVar4) {
                  stbi__g_failure_reason = pcVar18;
                  return 0;
                }
              }
              if (scan != 0) {
                return 1;
              }
              uVar1 = s->img_x;
              uVar2 = s->img_y;
              uVar10 = 0;
              if ((uint)((0x40000000 / (ulong)uVar1) / (ulong)uVar6) < uVar2) {
                pcVar18 = "Image too large to decode";
              }
              else {
                uVar13 = (ulong)uVar6;
                if ((int)uVar6 < 1) {
                  uVar13 = uVar10;
                }
                uVar14 = 1;
                uVar19 = 1;
                while( true ) {
                  iVar5 = (int)uVar14;
                  iVar17 = (int)uVar19;
                  if (uVar13 * 0x60 - uVar10 == 0) break;
                  uVar6 = *(uint *)((long)&z->img_comp[0].h + uVar10);
                  uVar8 = *(uint *)((long)&z->img_comp[0].v + uVar10);
                  if (iVar5 < (int)uVar6) {
                    uVar14 = (ulong)uVar6;
                  }
                  if (iVar17 < (int)uVar8) {
                    uVar19 = (ulong)uVar8;
                  }
                  uVar10 = uVar10 + 0x60;
                }
                z->img_h_max = iVar5;
                z->img_v_max = iVar17;
                z->img_mcu_w = iVar5 * 8;
                z->img_mcu_h = iVar17 * 8;
                uVar10 = 0;
                uVar6 = ((uVar1 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
                z->img_mcu_x = uVar6;
                uVar8 = ((uVar2 + iVar17 * 8) - 1) / (uint)(iVar17 * 8);
                z->img_mcu_y = uVar8;
                psVar21 = z->fast_ac[3] + 0x1f8;
                while( true ) {
                  if (uVar13 == uVar10) {
                    return 1;
                  }
                  *(int *)(psVar21 + 0x22) =
                       (int)((*(int *)(psVar21 + 0x16) * uVar1 + iVar5 + -1) / uVar14);
                  *(int *)(psVar21 + 0x24) =
                       (int)((*(int *)(psVar21 + 0x18) * uVar2 + iVar17 + -1) / uVar19);
                  iVar15 = *(int *)(psVar21 + 0x16) * uVar6;
                  *(int *)(psVar21 + 0x26) = iVar15 * 8;
                  iVar20 = *(int *)(psVar21 + 0x18) * uVar8;
                  *(int *)(psVar21 + 0x28) = iVar20 * 8;
                  pvVar9 = malloc((long)(int)(iVar20 * 8 * iVar15 * 8 | 0xf));
                  *(void **)(psVar21 + 0x30) = pvVar9;
                  if (pvVar9 == (void *)0x0) break;
                  *(ulong *)(psVar21 + 0x2c) = (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
                  *(undefined8 *)(psVar21 + 0x38) = 0;
                  if (z->progressive == 0) {
                    uVar11 = 0;
                    pvVar9 = (void *)0x0;
                  }
                  else {
                    *(int *)(psVar21 + 0x40) = iVar15;
                    *(int *)(psVar21 + 0x42) = iVar20;
                    pvVar9 = malloc((long)(iVar15 * iVar20 * 0x40) * 2 + 0xf);
                    uVar11 = (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
                  }
                  *(ulong *)(psVar21 + 0x3c) = uVar11;
                  *(void **)(psVar21 + 0x34) = pvVar9;
                  uVar10 = uVar10 + 1;
                  psVar21 = psVar21 + 0x30;
                }
                for (; pcVar18 = "Out of memory", 0 < (long)uVar10; uVar10 = uVar10 - 1) {
                  free(*(void **)psVar21);
                  psVar21[-4] = 0;
                  psVar21[-3] = 0;
                  psVar21[-2] = 0;
                  psVar21[-1] = 0;
                  psVar21 = psVar21 + -0x30;
                }
              }
            }
          }
        }
      }
      else {
        pcVar18 = "JPEG format not supported: 8-bit only";
      }
    }
  }
  stbi__g_failure_reason = pcVar18;
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}